

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<float> __thiscall
qclab::dense::operator-(dense *this,SquareMatrix<float> *lhs,SquareMatrix<float> *rhs)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  data_type extraout_RDX;
  float *pfVar4;
  long lVar5;
  int64_t i;
  long lVar6;
  SquareMatrix<float> SVar7;
  
  lVar1 = rhs->size_;
  lVar2 = lhs->size_;
  if (lVar1 == lVar2) {
    if (0 < lVar2) {
      pfVar3 = (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      pfVar4 = (lhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      lVar5 = 0;
      do {
        lVar6 = 0;
        do {
          pfVar4[lVar6] = pfVar4[lVar6] - pfVar3[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar2 != lVar6);
        lVar5 = lVar5 + 1;
        pfVar4 = pfVar4 + lVar2;
        pfVar3 = pfVar3 + lVar1;
      } while (lVar5 != lVar2);
    }
    SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)this,lhs);
    SVar7.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    SVar7.size_ = (size_type_conflict)this;
    return SVar7;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0xa4,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator-=(const SquareMatrix<T> &) [T = float]"
               );
}

Assistant:

inline int64_t rows() const { return size_ ; }